

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O0

header_used * __thiscall
first_fit_heap<64UL>::free_list_container::alloc(free_list_container *this,size_t size)

{
  bool bVar1;
  unsigned_long *puVar2;
  header_free *this_00;
  size_t sVar3;
  ulong uVar4;
  header_free *phVar5;
  header_free *phVar6;
  header_used *this_01;
  header_used *following;
  header_free *new_block;
  size_t size_remaining;
  header_free *block;
  iterator local_38;
  iterator it;
  iterator prev;
  size_t local_20;
  size_t size_local;
  free_list_container *this_local;
  
  prev.block = (header_free *)0x40;
  local_20 = size;
  size_local = (size_t)this;
  puVar2 = std::max<unsigned_long>(&local_20,(unsigned_long *)&prev);
  local_20 = *puVar2;
  local_20 = align(this,local_20);
  iterator::iterator(&it,(header_free *)0x0);
  local_38 = first_free(this,local_20,&it);
  block = (header_free *)end(this);
  bVar1 = iterator::operator==(&local_38,(iterator *)&block);
  if (bVar1) {
    this_local = (free_list_container *)0x0;
  }
  else {
    this_00 = iterator::operator*(&local_38);
    sVar3 = header_used::size(&this_00->super_header_used);
    uVar4 = sVar3 - local_20;
    if (uVar4 < 0x50) {
      local_20 = uVar4 + local_20;
    }
    else {
      header_used::size(&this_00->super_header_used,local_20);
      header_free::update_footer(this_00);
      phVar5 = (header_free *)header_used::following_block(&this_00->super_header_used,this->mem);
      header_free::header_free(phVar5,uVar4 - 0x40);
      phVar6 = header_free::next(this_00);
      header_free::next(phVar5,phVar6);
      header_used::prev_free((header_used *)phVar5,true);
      header_free::next(this_00,phVar5);
    }
    phVar5 = iterator::operator*(&it);
    if (phVar5 == (header_free *)0x0) {
      phVar5 = header_free::next(this_00);
      this->list = phVar5;
    }
    else {
      phVar5 = iterator::operator*(&it);
      phVar6 = header_free::next(this_00);
      header_free::next(phVar5,phVar6);
    }
    this_01 = header_used::following_block(&this_00->super_header_used,this->mem);
    if (this_01 != (header_used *)0x0) {
      header_used::prev_free(this_01,false);
    }
    header_used::is_free(&this_00->super_header_used,false);
    this_local = (free_list_container *)this_00;
  }
  return (header_used *)this_local;
}

Assistant:

header_used *alloc(size_t size)
        {
            size = HEAP_MAX(size, ALIGNMENT);
            size = align(size);

            iterator prev;
            auto it = first_free(size, prev);

            if (it == end()) {
                return nullptr;
            }

            auto  &block          = **it;
            size_t size_remaining = block.size() - size;

            if (size_remaining < (sizeof(header_free) + sizeof(footer))) {
                // remaining size cannot hold another block, use entire space
                size += size_remaining;
            } else {
                // split block into two
                block.size(size);
                block.update_footer();
                auto *new_block = new (block.following_block(mem)) header_free(size_remaining - sizeof(header_used));
                new_block->next(block.next());
                new_block->prev_free(true);
                block.next(new_block);
            }

            if (*prev) {
                (*prev)->next(block.next());
            } else {
                list = block.next();
            }

            auto *following = block.following_block(mem);
            if (following) {
                following->prev_free(false);
            }

            block.is_free(false);
            return &block;
        }